

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

dgBigVector * __thiscall
dgMeshEffect::GetOrigin(dgBigVector *__return_storage_ptr__,dgMeshEffect *this)

{
  double *pdVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  dgTemplateVector<double> local_28;
  
  uVar2 = *(uint *)&(this->super_dgRefCounter).field_0xc;
  local_28.m_x = 0.0;
  local_28.m_y = 0.0;
  local_28.m_z = 0.0;
  for (lVar3 = 0; (ulong)(~((int)uVar2 >> 0x1f) & uVar2) << 5 != lVar3; lVar3 = lVar3 + 0x20) {
    pdVar1 = (double *)((long)&(this->m_points->super_dgTemplateVector<double>).m_x + lVar3);
    local_28.m_x = local_28.m_x + *pdVar1;
    local_28.m_y = local_28.m_y + pdVar1[1];
    local_28.m_z = local_28.m_z +
                   *(double *)((long)&(this->m_points->super_dgTemplateVector<double>).m_z + lVar3);
  }
  dVar4 = 1.0 / (double)(int)uVar2;
  local_28.m_z = local_28.m_z * dVar4;
  local_28.m_x = local_28.m_x * dVar4;
  local_28.m_y = local_28.m_y * dVar4;
  local_28.m_w = 0.0;
  dgBigVector::dgBigVector(__return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

dgBigVector dgMeshEffect::GetOrigin ()const
{
	dgBigVector origin (hacd::HaF64 (0.0f), hacd::HaF64 (0.0f), hacd::HaF64 (0.0f), hacd::HaF64 (0.0f));	
	for (hacd::HaI32 i = 0; i < m_pointCount; i ++) {
		origin += m_points[i];
	}	
	return origin.Scale (hacd::HaF64 (1.0f) / m_pointCount);
}